

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_27f4c0::PeerManagerImpl::ProcessGetCFCheckPt
          (PeerManagerImpl *this,CNode *node,Peer *peer,DataStream *vRecv)

{
  uint256 *puVar1;
  CConnman *this_00;
  string msg_type;
  void *pvVar2;
  uint8_t filter_type;
  bool bVar3;
  ulong uVar4;
  CBlockIndex *this_01;
  Logger *this_02;
  string *args;
  DataStream *__nbytes;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  int height;
  ulong uVar6;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  vector<uint256,_std::allocator<uint256>_> headers;
  BlockFilterIndex *filter_index;
  CBlockIndex *stop_index;
  uint8_t filter_type_ser;
  uint256 local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  undefined8 local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  uint256 stop_hash;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  undefined8 uStack_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  uint8_t obj;
  undefined7 uStack_6f;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  __nbytes = vRecv;
  DataStream::read(vRecv,(int)&obj,(void *)0x1,(size_t)vRecv);
  filter_type = obj;
  filter_type_ser = obj;
  DataStream::read(vRecv,(int)&stop_hash,(void *)0x20,(size_t)__nbytes);
  bVar3 = PrepareBlockFilterRequest
                    (this,node,(Peer *)peer->m_our_services,filter_type,0,&stop_hash,0xffffffff,
                     &stop_index,&filter_index);
  if (bVar3) {
    std::vector<uint256,_std::allocator<uint256>_>::vector
              (&headers,(long)(stop_index->nHeight / 1000),(allocator_type *)&obj);
    uVar4 = (ulong)((long)headers.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)headers.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 5;
    uVar6 = uVar4 & 0xffffffff;
    height = (int)uVar4 * 1000;
    this_01 = stop_index;
    do {
      uVar6 = uVar6 - 1;
      if ((int)(uint)uVar6 < 0) {
        local_d8 = &local_c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"cfcheckpt","");
        puVar1 = stop_index->phashBlock;
        if (puVar1 == (uint256 *)0x0) goto LAB_001e064b;
        local_f8.super_base_blob<256U>.m_data._M_elems._0_8_ =
             *(undefined8 *)(puVar1->super_base_blob<256U>).m_data._M_elems;
        local_f8.super_base_blob<256U>.m_data._M_elems._8_8_ =
             *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
        local_f8.super_base_blob<256U>.m_data._M_elems._16_8_ =
             *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
        local_f8.super_base_blob<256U>.m_data._M_elems._24_8_ =
             *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
        this_00 = this->m_connman;
        if (local_d8 == &local_c8) {
          local_88._8_8_ = local_c8._8_8_;
          local_98 = &local_88;
        }
        else {
          local_98 = local_d8;
        }
        local_88._M_allocated_capacity._1_7_ = local_c8._M_allocated_capacity._1_7_;
        local_88._M_local_buf[0] = local_c8._M_local_buf[0];
        uStack_90 = local_d0;
        local_d0 = 0;
        local_c8._M_local_buf[0] = '\0';
        msg_type._M_string_length = (size_type)this;
        msg_type._M_dataplus._M_p = (pointer)node;
        msg_type.field_2._M_allocated_capacity =
             (size_type)
             headers.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_start;
        msg_type.field_2._8_8_ =
             headers.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_d8 = &local_c8;
        NetMsg::Make<unsigned_char&,uint256,std::vector<uint256,std::allocator<uint256>>&>
                  ((CSerializedNetMsg *)&obj,(NetMsg *)&local_98,msg_type,&filter_type_ser,&local_f8
                   ,&headers);
        CConnman::PushMessage(this_00,node,(CSerializedNetMsg *)&obj);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._8_8_ != &local_48) {
          operator_delete((void *)local_60._8_8_,local_48._M_allocated_capacity + 1);
        }
        pvVar2 = (void *)CONCAT71(uStack_6f,obj);
        if (pvVar2 != (void *)0x0) {
          operator_delete(pvVar2,local_60._M_allocated_capacity - (long)pvVar2);
        }
        if (local_98 != &local_88) {
          operator_delete(local_98,local_88._M_allocated_capacity + 1);
        }
        if (local_d8 == &local_c8) goto LAB_001e0609;
        local_60._M_allocated_capacity =
             CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]);
        paVar5 = local_d8;
        goto LAB_001e0601;
      }
      this_01 = CBlockIndex::GetAncestor(this_01,height);
      bVar3 = BlockFilterIndex::LookupFilterHeader
                        (filter_index,this_01,
                         headers.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                         super__Vector_impl_data._M_start + ((uint)uVar6 & 0x7fffffff));
      height = height + -1000;
    } while (bVar3);
    this_02 = LogInstance();
    bVar3 = BCLog::Logger::WillLogCategoryLevel(this_02,NET,Debug);
    if (bVar3) {
      args = BlockFilterTypeName_abi_cxx11_(filter_type);
      puVar1 = this_01->phashBlock;
      if (puVar1 == (uint256 *)0x0) {
LAB_001e064b:
        __assert_fail("phashBlock != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                      ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
      }
      local_98 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   **)(puVar1->super_base_blob<256U>).m_data._M_elems;
      uStack_90 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
      local_88._M_allocated_capacity =
           *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
      local_88._8_8_ = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
      base_blob<256u>::ToString_abi_cxx11_((string *)&obj,&local_98);
      logging_function._M_str = "ProcessGetCFCheckPt";
      logging_function._M_len = 0x13;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
      ;
      source_file._M_len = 0x62;
      LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                (logging_function,source_file,0xe0a,NET,Debug,(ConstevalFormatString<2U>)0x7d6369,
                 args,(string *)&obj);
      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)CONCAT71(uStack_6f,obj);
      if (paVar5 != &local_60) {
LAB_001e0601:
        operator_delete(paVar5,local_60._M_allocated_capacity + 1);
      }
    }
LAB_001e0609:
    if (headers.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(headers.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)headers.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)headers.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::ProcessGetCFCheckPt(CNode& node, Peer& peer, DataStream& vRecv)
{
    uint8_t filter_type_ser;
    uint256 stop_hash;

    vRecv >> filter_type_ser >> stop_hash;

    const BlockFilterType filter_type = static_cast<BlockFilterType>(filter_type_ser);

    const CBlockIndex* stop_index;
    BlockFilterIndex* filter_index;
    if (!PrepareBlockFilterRequest(node, peer, filter_type, /*start_height=*/0, stop_hash,
                                   /*max_height_diff=*/std::numeric_limits<uint32_t>::max(),
                                   stop_index, filter_index)) {
        return;
    }

    std::vector<uint256> headers(stop_index->nHeight / CFCHECKPT_INTERVAL);

    // Populate headers.
    const CBlockIndex* block_index = stop_index;
    for (int i = headers.size() - 1; i >= 0; i--) {
        int height = (i + 1) * CFCHECKPT_INTERVAL;
        block_index = block_index->GetAncestor(height);

        if (!filter_index->LookupFilterHeader(block_index, headers[i])) {
            LogDebug(BCLog::NET, "Failed to find block filter header in index: filter_type=%s, block_hash=%s\n",
                         BlockFilterTypeName(filter_type), block_index->GetBlockHash().ToString());
            return;
        }
    }

    MakeAndPushMessage(node, NetMsgType::CFCHECKPT,
              filter_type_ser,
              stop_index->GetBlockHash(),
              headers);
}